

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O3

void __thiscall
tchecker::clockbounds::local_m_map_t::bounds(local_m_map_t *this,loc_id_t id,map_t *M)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  int iVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long lVar8;
  
  auVar2 = _DAT_001d5360;
  if (this->_loc_nb <= id) {
    __assert_fail("id < _loc_nb",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                  ,0x1c8,
                  "void tchecker::clockbounds::local_m_map_t::bounds(tchecker::loc_id_t, tchecker::clockbounds::map_t &) const"
                 );
  }
  uVar1 = (M->super_array_capacity_t<unsigned_int>)._capacity;
  uVar3 = (ulong)uVar1;
  if (uVar1 != this->_clock_nb) {
    __assert_fail("M.capacity() == _clock_nb",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                  ,0x1c9,
                  "void tchecker::clockbounds::local_m_map_t::bounds(tchecker::loc_id_t, tchecker::clockbounds::map_t &) const"
                 );
  }
  if (uVar3 != 0) {
    lVar8 = uVar3 - 1;
    auVar5._8_4_ = (int)lVar8;
    auVar5._0_8_ = lVar8;
    auVar5._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar4 = 0;
    auVar5 = auVar5 ^ _DAT_001d5360;
    auVar7 = _DAT_001d6a50;
    auVar9 = _DAT_001d5350;
    do {
      auVar10 = auVar9 ^ auVar2;
      iVar6 = auVar5._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar6 && auVar5._0_4_ < auVar10._0_4_ || iVar6 < auVar10._4_4_)
                & 1)) {
        *(undefined4 *)(&(M->_fam).field_0x0 + uVar4) = 0xc0000001;
      }
      if ((auVar10._12_4_ != auVar5._12_4_ || auVar10._8_4_ <= auVar5._8_4_) &&
          auVar10._12_4_ <= auVar5._12_4_) {
        *(undefined4 *)((long)&M[1].super_array_capacity_t<unsigned_int>._capacity + uVar4) =
             0xc0000001;
      }
      auVar10 = auVar7 ^ auVar2;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar6 && (iVar11 != iVar6 || auVar10._0_4_ <= auVar5._0_4_)) {
        *(undefined4 *)(&M[1]._fam.field_0x0 + uVar4) = 0xc0000001;
        *(undefined4 *)((long)&M[2].super_array_capacity_t<unsigned_int>._capacity + uVar4) =
             0xc0000001;
      }
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar8 + 4;
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar8 + 4;
      uVar4 = uVar4 + 0x10;
    } while ((uVar3 * 4 + 0xc & 0xfffffffffffffff0) != uVar4);
  }
  update(M,(this->_M).
           super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[id]);
  return;
}

Assistant:

void local_m_map_t::bounds(tchecker::loc_id_t id, tchecker::clockbounds::map_t & M) const
{
  assert(id < _loc_nb);
  assert(M.capacity() == _clock_nb);
  tchecker::clockbounds::clear(M);
  tchecker::clockbounds::update(M, *_M[id]);
}